

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::InternalSwap
          (RandomUniformStaticLayerParams *this,RandomUniformStaticLayerParams *other)

{
  intptr_t iVar1;
  int64_t iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  iVar2 = this->seed_;
  fVar5 = this->minval_;
  fVar6 = this->maxval_;
  fVar3 = other->minval_;
  fVar4 = other->maxval_;
  this->seed_ = other->seed_;
  this->minval_ = fVar3;
  this->maxval_ = fVar4;
  other->seed_ = iVar2;
  other->minval_ = fVar5;
  other->maxval_ = fVar6;
  return;
}

Assistant:

void RandomUniformStaticLayerParams::InternalSwap(RandomUniformStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  outputshape_.InternalSwap(&other->outputshape_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(RandomUniformStaticLayerParams, maxval_)
      + sizeof(RandomUniformStaticLayerParams::maxval_)
      - PROTOBUF_FIELD_OFFSET(RandomUniformStaticLayerParams, seed_)>(
          reinterpret_cast<char*>(&seed_),
          reinterpret_cast<char*>(&other->seed_));
}